

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::MergeFrom
          (CodeGeneratorResponse *this,CodeGeneratorResponse *from)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  CodeGeneratorResponse_File *from_00;
  void **ppvVar4;
  LogMessage *other;
  CodeGeneratorResponse_File *this_00;
  string *psVar5;
  long lVar6;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x40e);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->file_).super_RepeatedPtrFieldBase,
             (from->file_).super_RepeatedPtrFieldBase.current_size_ +
             (this->file_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      from_00 = (CodeGeneratorResponse_File *)
                (from->file_).super_RepeatedPtrFieldBase.elements_[lVar6];
      iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
      iVar3 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar3) {
        ppvVar4 = (this->file_).super_RepeatedPtrFieldBase.elements_;
        (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_00 = (CodeGeneratorResponse_File *)ppvVar4[iVar2];
      }
      else {
        iVar2 = (this->file_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar3 == iVar2) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->file_).super_RepeatedPtrFieldBase,iVar2 + 1);
        }
        piVar1 = &(this->file_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::
                  GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>::New();
        ppvVar4 = (this->file_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
        (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar4[iVar2] = this_00;
      }
      CodeGeneratorResponse_File::MergeFrom(this_00,from_00);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (from->file_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((from->_has_bits_[0] & 1) != 0) {
    this->_has_bits_[0] = this->_has_bits_[0] | 1;
    if (this->error_ == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar5 = (string *)operator_new(0x20);
      (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
      psVar5->_M_string_length = 0;
      (psVar5->field_2)._M_local_buf[0] = '\0';
      this->error_ = psVar5;
    }
    std::__cxx11::string::_M_assign((string *)this->error_);
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void CodeGeneratorResponse::MergeFrom(const CodeGeneratorResponse& from) {
  GOOGLE_CHECK_NE(&from, this);
  file_.MergeFrom(from.file_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_error()) {
      set_error(from.error());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}